

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_example.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::ApiExample::DealableQuotes
          (ApiExample *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *liquidity_providers)

{
  long lVar1;
  bool bVar2;
  reference pbVar3;
  pointer pBVar4;
  pointer pBVar5;
  string *psVar6;
  undefined8 *puVar7;
  Tenor *pTVar8;
  allocator<char> local_3b1;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [32];
  undefined8 local_368;
  FX local_360 [64];
  undefined8 local_320;
  string local_318 [32];
  Subject local_2f8 [31];
  allocator<char> local_2d9;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [32];
  undefined8 local_290;
  FX local_288 [64];
  undefined8 local_248;
  string local_240 [32];
  Subject local_220 [31];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  undefined8 local_1b8;
  FX local_1b0 [64];
  undefined8 local_170;
  string local_168 [32];
  Subject local_148 [31];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [48];
  undefined8 local_d0;
  FX local_c8 [64];
  undefined8 local_88;
  string local_80 [24];
  Subject local_68 [24];
  string local_50 [8];
  string lp;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *liquidity_providers_local;
  ApiExample *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(liquidity_providers);
  lp.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(liquidity_providers);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&lp.field_2 + 8));
    if (!bVar2) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_50,(string *)pbVar3);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    lVar1 = *(long *)(*(long *)pBVar4 + -0x30);
    pBVar5 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    local_d0 = (**(code **)(*(long *)pBVar5 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_88 = bidfx_public_api::price::subject::SubjectFactory::FX::Quote();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
    psVar6 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider(local_80)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_100,"EURUSD",&local_101);
    psVar6 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(psVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_128,"EUR",&local_129);
    bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar6);
    puVar7 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Quantity(1000000.11);
    (**(code **)*puVar7)(local_68);
    (**(code **)(*(long *)(pBVar4 + lVar1) + 8))(pBVar4 + lVar1,local_68);
    price::subject::Subject::~Subject(local_68);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    price::subject::SubjectFactory::FX::~FX(local_c8);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    lVar1 = *(long *)(*(long *)pBVar4 + -0x30);
    pBVar5 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    local_1b8 = (**(code **)(*(long *)pBVar5 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_170 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
    psVar6 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                       (local_168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1d8,"EURUSD",&local_1d9);
    psVar6 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_200,"EUR",&local_201);
    bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar6);
    pTVar8 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                (1000000.0);
    puVar7 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar8);
    (**(code **)*puVar7)(local_148);
    (**(code **)(*(long *)(pBVar4 + lVar1) + 8))(pBVar4 + lVar1,local_148);
    price::subject::Subject::~Subject(local_148);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    price::subject::SubjectFactory::FX::~FX(local_1b0);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    lVar1 = *(long *)(*(long *)pBVar4 + -0x30);
    pBVar5 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    local_290 = (**(code **)(*(long *)pBVar5 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_248 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Swap();
    psVar6 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider
                       (local_240);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2b0,"CHFJPY",&local_2b1);
    psVar6 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2d8,"CHF",&local_2d9);
    bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar6);
    pTVar8 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                                (15000000.0);
    bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar8);
    pTVar8 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                                (15000000.0);
    puVar7 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar8);
    (**(code **)*puVar7)(local_220);
    (**(code **)(*(long *)(pBVar4 + lVar1) + 8))(pBVar4 + lVar1,local_220);
    price::subject::Subject::~Subject(local_220);
    std::__cxx11::string::~string(local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    price::subject::SubjectFactory::FX::~FX(local_288);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    lVar1 = *(long *)(*(long *)pBVar4 + -0x30);
    pBVar5 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    local_368 = (**(code **)(*(long *)pBVar5 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_320 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Nds();
    psVar6 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider
                       (local_318);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_388,"USDCNY",&local_389);
    psVar6 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3b0,"USD",&local_3b1);
    bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar6);
    pTVar8 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                                (10000000.0);
    bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar8);
    pTVar8 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                                (8500000.0);
    puVar7 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar8);
    (**(code **)*puVar7)(local_2f8);
    (**(code **)(*(long *)(pBVar4 + lVar1) + 8))(pBVar4 + lVar1,local_2f8);
    price::subject::Subject::~Subject(local_2f8);
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator(&local_389);
    price::subject::SubjectFactory::FX::~FX(local_360);
    std::__cxx11::string::~string(local_50);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ApiExample::DealableQuotes(std::vector<std::string> liquidity_providers)
{
    for (std::string lp : liquidity_providers)
    {
        subscriber_->Subscribe(subscriber_->Subjects().Fx().Quote().Spot()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000.11)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Forward()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000)
                .Tenor(Tenor::IN_1_MONTH)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Swap()
                .LiquidityProvider(lp)
                .CurrencyPair("CHFJPY")
                .Currency("CHF")
                .NearQuantity(15000000)
                .NearTenor(Tenor::IN_3_MONTHS)
                .FarQuantity(15000000)
                .FarTenor(Tenor::IN_1_YEAR)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Nds()
                .LiquidityProvider(lp)
                .CurrencyPair("USDCNY")
                .Currency("USD")
                .NearQuantity(10000000)
                .NearTenor(Tenor::IN_1_YEAR)
                .FarQuantity(8500000)
                .FarTenor(Tenor::IN_3_YEARS)
                .CreateSubject());
    }
}